

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_raster_new(FT_Memory memory,SDF_PRaster *araster)

{
  SDF_PRaster pSVar1;
  SDF_PRaster raster;
  SDF_PRaster *ppSStack_18;
  FT_Error error;
  SDF_PRaster *araster_local;
  FT_Memory memory_local;
  
  ppSStack_18 = araster;
  araster_local = (SDF_PRaster *)memory;
  pSVar1 = (SDF_PRaster)ft_mem_alloc(memory,8,(FT_Error *)((long)&raster + 4));
  if (raster._4_4_ == 0) {
    pSVar1->memory = (FT_Memory)araster_local;
  }
  *ppSStack_18 = pSVar1;
  return raster._4_4_;
}

Assistant:

static FT_Error
  sdf_raster_new( FT_Memory     memory,
                  SDF_PRaster*  araster )
  {
    FT_Error     error;
    SDF_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

   return error;
  }